

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O0

bool callMultipleSimpleFoo(void)

{
  int iVar1;
  allocator<char> local_71;
  string local_70;
  int local_40;
  int local_3c;
  int i;
  int callsNumber;
  Test t;
  
  Test::Test((Test *)&i);
  local_3c = 10;
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    accessor::callFunction<accessor::FunctionWrapper<Test,void>,Test>((Test *)&i);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_71);
  iVar1 = Test::getMethodVisitedCounter((Test *)&i,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  Test::~Test((Test *)&i);
  return iVar1 == 10;
}

Assistant:

bool callMultipleSimpleFoo()
{
  Test t;
  int callsNumber = 10;

  for (int i = 0; i < callsNumber; ++i )
  {
    ::accessor::callFunction<TestFoo>(t);
  }

  return (t.getMethodVisitedCounter("foo") == 10);
}